

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transform.cpp
# Opt level: O2

SpatialInertia * __thiscall
iDynTree::Transform::operator*
          (SpatialInertia *__return_storage_ptr__,Transform *this,SpatialInertia *op2)

{
  double mass;
  Map<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_> newI;
  Position newCenterOfMass;
  Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> newCOM;
  RotationalInertia newRotInertia;
  RotationalInertia oldRotInertiaWrtCom;
  RotationalInertia *local_1b8 [2];
  Position local_1a8;
  Position *local_190 [2];
  PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> local_180 [24];
  RotationalInertia local_168;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>,_Eigen::Transpose<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>,_0>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  local_120;
  Matrix<double,_3,_3,_0,_3,_3> local_c0;
  RotationalInertia local_78;
  
  mass = SpatialInertia::getMass(op2);
  SpatialInertia::getCenterOfMass((Position *)&local_120,op2);
  transform<iDynTree::Position>(&local_1a8,this,(Position *)&local_120);
  RotationalInertia::RotationalInertia(&local_168);
  local_1b8[0] = &local_168;
  SpatialInertia::getRotationalInertiaWrtCenterOfMass(&local_78,op2);
  local_190[0] = &local_1a8;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (local_180,
             (DenseBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
              *)local_190);
  squareCrossProductMatrix((Vector3d *)local_180);
  local_120.m_lhs.m_lhs.m_lhs.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)&this->rot;
  local_120.m_lhs.m_lhs.m_rhs.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)&local_78;
  local_120.m_lhs.m_rhs.m_matrix.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)&this->rot;
  local_120.m_rhs.m_lhs.m_functor.m_other = mass;
  local_120.m_rhs.m_rhs = &local_c0;
  Eigen::internal::
  call_assignment<Eigen::Map<Eigen::Matrix<double,3,3,0,3,3>,0,Eigen::Stride<0,0>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Product<Eigen::Product<Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>const,0,Eigen::Stride<0,0>>,Eigen::Map<Eigen::Matrix<double,3,3,0,3,3>const,0,Eigen::Stride<0,0>>,0>,Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>const,0,Eigen::Stride<0,0>>>,0>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::Matrix<double,3,3,0,3,3>const>const>>
            ((Map<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_> *)local_1b8,
             &local_120);
  SpatialInertia::SpatialInertia(__return_storage_ptr__,mass,&local_1a8,&local_168);
  return __return_storage_ptr__;
}

Assistant:

SpatialInertia Transform::operator*(const SpatialInertia& op2) const
{
    return transform<SpatialInertia>(*this,op2);
}